

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O1

int png_safe_execute(png_imagep image_in,_func_int_png_voidp *function,png_voidp arg)

{
  png_voidp pvVar1;
  int iVar2;
  int result;
  png_imagep image;
  png_voidp saved_error_buf;
  jmp_buf safe_jmpbuf;
  uint local_fc;
  __jmp_buf_tag local_e8;
  
  pvVar1 = image_in->opaque->error_buf;
  iVar2 = _setjmp(&local_e8);
  local_fc = (uint)(iVar2 == 0);
  if (local_fc != 0) {
    image_in->opaque->error_buf = &local_e8;
    local_fc = (*function)(arg);
  }
  image_in->opaque->error_buf = pvVar1;
  if (local_fc == 0) {
    png_image_free(image_in);
  }
  return local_fc;
}

Assistant:

int /* PRIVATE */
png_safe_execute(png_imagep image_in, int (*function)(png_voidp), png_voidp arg)
{
   volatile png_imagep image = image_in;
   volatile int result;
   volatile png_voidp saved_error_buf;
   jmp_buf safe_jmpbuf;

   /* Safely execute function(arg) with png_error returning to this function. */
   saved_error_buf = image->opaque->error_buf;
   result = setjmp(safe_jmpbuf) == 0;

   if (result != 0)
   {

      image->opaque->error_buf = safe_jmpbuf;
      result = function(arg);
   }

   image->opaque->error_buf = saved_error_buf;

   /* And do the cleanup prior to any failure return. */
   if (result == 0)
      png_image_free(image);

   return result;
}